

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_escon_compliance_codes(tcv_t *tcv,tcv_escon_compliance_codes_t *codes)

{
  tcv_escon_compliance_codes_t *codes_local;
  tcv_t *tcv_local;
  
  if (((tcv == (tcv_t *)0x0) || (codes == (tcv_escon_compliance_codes_t *)0x0)) ||
     (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = -4;
  }
  else {
    codes->bmp = '\0';
    codes->bmp = (uint8_t)((int)(*(byte *)((long)tcv->data + 5) & 0xc0) >> 6);
    tcv_local._4_4_ = 0;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_escon_compliance_codes(tcv_t *tcv, tcv_escon_compliance_codes_t *codes)
{
	if (tcv == NULL || codes == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear bitmap */
	codes->bmp = 0;

	codes->bmp = (((sfp_data_t*)tcv->data)->a0[ESCON_COMPLIANCE_REG] & ESCON_MASK) >> 6;

	return 0;
}